

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  sqlite3 *db;
  char *zRight;
  Trigger *pTVar4;
  Index *pIVar5;
  int iVar6;
  int iVar7;
  Table *pTVar8;
  Vdbe *p;
  i16 *piVar9;
  HashElem *pHVar10;
  SrcList *pSrc;
  Parse *pPVar11;
  undefined4 in_register_0000000c;
  Schema **ppSVar12;
  long lVar13;
  undefined4 in_register_00000014;
  FKey *pFVar14;
  ulong uVar15;
  int *piVar16;
  Schema *pSVar17;
  long lVar18;
  uint uVar19;
  sColMap *psVar20;
  char *zDbase;
  bool bVar21;
  ulong local_88;
  int *aiFree;
  Index *pIdx;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  int *local_58;
  int *local_50;
  int local_48;
  int iCol;
  char *local_40;
  i16 *local_38;
  
  local_68 = CONCAT44(in_register_00000014,regOld);
  local_60 = CONCAT44(in_register_0000000c,regNew);
  db = pParse->db;
  if ((db->flags & 0x80000) != 0) {
    pSVar17 = pTab->pSchema;
    if (pSVar17 == (Schema *)0x0) {
      local_88 = 0xfff0bdc0;
    }
    else {
      uVar19 = db->nDb;
      if ((int)uVar19 < 1) {
        local_88 = 0;
      }
      else {
        ppSVar12 = &db->aDb->pSchema;
        uVar15 = 0;
        do {
          local_88 = uVar15;
          if (*ppSVar12 == pSVar17) break;
          uVar15 = uVar15 + 1;
          ppSVar12 = ppSVar12 + 4;
          local_88 = (ulong)uVar19;
        } while (uVar19 != uVar15);
      }
    }
    uVar1 = pParse->disableTriggers;
    pFVar14 = pTab->pFKey;
    local_6c = bChngRowid;
    local_58 = aChange;
    if (pFVar14 != (FKey *)0x0) {
      zDbase = db->aDb[(int)local_88].zDbSName;
      local_48 = regOld + 1;
      local_40 = zDbase;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (aChange == (int *)0x0) {
LAB_0016ee93:
          if (pParse->disableTriggers == '\0') {
            pTVar8 = sqlite3LocateTable(pParse,0,pFVar14->zTo,zDbase);
          }
          else {
            pTVar8 = sqlite3FindTable(db,pFVar14->zTo,zDbase);
          }
          if ((pTVar8 == (Table *)0x0) ||
             (iVar7 = sqlite3FkLocateIndex(pParse,pTVar8,pFVar14,&pIdx,&aiFree), pIVar5 = pIdx,
             iVar7 != 0)) {
            if (uVar1 == '\0') {
              return;
            }
            if (db->mallocFailed != '\0') {
              return;
            }
            if (pTVar8 == (Table *)0x0) {
              p = pParse->pVdbe;
              if (p == (Vdbe *)0x0) {
                p = allocVdbe(pParse);
              }
              iVar6 = local_48;
              iVar7 = pFVar14->nCol;
              if (0 < iVar7) {
                iVar3 = p->nOp;
                psVar20 = pFVar14->aCol;
                lVar13 = 0;
                do {
                  sqlite3VdbeAddOp3(p,0x22,psVar20->iFrom + iVar6,iVar3 + iVar7 + 1,0);
                  lVar13 = lVar13 + 1;
                  psVar20 = psVar20 + 1;
                } while (lVar13 < pFVar14->nCol);
              }
              sqlite3VdbeAddOp3(p,0x8f,(uint)pFVar14->isDeferred,-1,0);
              aChange = local_58;
              zDbase = local_40;
              bChngRowid = local_6c;
            }
          }
          else {
            piVar16 = aiFree;
            if (aiFree == (int *)0x0) {
              iCol = pFVar14->aCol[0].iFrom;
              piVar16 = &iCol;
            }
            local_50 = piVar16;
            if (pFVar14->nCol < 1) {
              uVar19 = 0;
            }
            else {
              local_38 = &pTVar8->iPKey;
              lVar18 = 0;
              lVar13 = 0;
              uVar19 = 0;
              do {
                if (*(int *)((long)piVar16 + lVar18 * 2) == (int)pTab->iPKey) {
                  *(undefined4 *)((long)piVar16 + lVar18 * 2) = 0xffffffff;
                }
                if (db->xAuth != (sqlite3_xauth)0x0) {
                  piVar9 = local_38;
                  if (pIVar5 != (Index *)0x0) {
                    piVar9 = (i16 *)((long)pIVar5->aiColumn + lVar18);
                  }
                  iVar7 = sqlite3AuthReadCol(pParse,pTVar8->zName,pTVar8->aCol[*piVar9].zName,
                                             (int)local_88);
                  uVar19 = (uint)(iVar7 == 2);
                  piVar16 = local_50;
                }
                lVar13 = lVar13 + 1;
                lVar18 = lVar18 + 2;
              } while (lVar13 < pFVar14->nCol);
            }
            sqlite3TableLock(pParse,(int)local_88,pTVar8->tnum,'\0',pTVar8->zName);
            pParse->nTab = pParse->nTab + 1;
            if ((int)local_68 != 0) {
              fkLookupParent(pParse,(int)local_88,pTVar8,pIdx,pFVar14,local_50,(int)local_68,-1,
                             uVar19);
            }
            aChange = local_58;
            bChngRowid = local_6c;
            if ((int)local_60 != 0) {
              pPVar11 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar11 = pParse;
              }
              if ((pPVar11->pTriggerPrg == (TriggerPrg *)0x0) ||
                 (((pTVar4 = pPVar11->pTriggerPrg->pTrigger, pTVar4 != pFVar14->apTrigger[0] ||
                   (pFVar14->aAction[0] != '\a')) &&
                  ((pTVar4 != pFVar14->apTrigger[1] || (pFVar14->aAction[1] != '\a')))))) {
                fkLookupParent(pParse,(int)local_88,pTVar8,pIdx,pFVar14,local_50,(int)local_60,1,
                               uVar19);
              }
            }
            sqlite3DbFree(db,aiFree);
            zDbase = local_40;
          }
        }
        else {
          zRight = pFVar14->zTo;
          if (pTab->zName == (char *)0x0) {
            iVar7 = -(uint)(zRight != (char *)0x0);
LAB_0016ee54:
            if (iVar7 == 0) goto LAB_0016ee93;
          }
          else if (zRight != (char *)0x0) {
            iVar7 = sqlite3StrICmp(pTab->zName,zRight);
            goto LAB_0016ee54;
          }
          if (0 < (long)pFVar14->nCol) {
            lVar13 = 0;
            do {
              iVar7 = *(int *)((long)&pFVar14->aCol[0].iFrom + lVar13);
              if ((-1 < aChange[iVar7]) || ((bChngRowid != 0 && (iVar7 == pTab->iPKey))))
              goto LAB_0016ee93;
              lVar13 = lVar13 + 0x10;
            } while ((long)pFVar14->nCol * 0x10 != lVar13);
          }
        }
        pFVar14 = pFVar14->pNextFrom;
      } while (pFVar14 != (FKey *)0x0);
      pSVar17 = pTab->pSchema;
    }
    pHVar10 = findElementWithHash(&pSVar17->fkeyHash,pTab->zName,(uint *)&pIdx);
    if ((pHVar10 != (HashElem *)0x0) && (pFVar14 = (FKey *)pHVar10->data, pFVar14 != (FKey *)0x0)) {
      bVar21 = aChange != (int *)0x0;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (((aChange == (int *)0x0) ||
            (iVar7 = fkParentIsModified(pTab,pFVar14,aChange,bChngRowid), iVar7 != 0)) &&
           ((pFVar14->isDeferred != '\0' ||
            ((((db->flags & 0x2000000) != 0 || (pParse->pToplevel != (Parse *)0x0)) ||
             (pParse->isMultiWrite != '\0')))))) {
          iVar7 = sqlite3FkLocateIndex(pParse,pTab,pFVar14,&pIdx,&aiFree);
          if (iVar7 == 0) {
            pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
            if (pSrc != (SrcList *)0x0) {
              pTVar8 = pFVar14->pFrom;
              pSrc->a[0].pTab = pTVar8;
              pSrc->a[0].zName = pTVar8->zName;
              pTVar8->nTabRef = pTVar8->nTabRef + 1;
              iVar7 = pParse->nTab;
              pParse->nTab = iVar7 + 1;
              pSrc->a[0].iCursor = iVar7;
              if ((int)local_60 != 0) {
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar14,aiFree,(int)local_60,-1);
              }
              if ((int)local_68 != 0) {
                uVar2 = pFVar14->aAction[bVar21];
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar14,aiFree,(int)local_68,1);
                if (((pFVar14->isDeferred == '\0') && (uVar2 != '\a')) && (uVar2 != '\t')) {
                  pPVar11 = pParse->pToplevel;
                  if (pParse->pToplevel == (Parse *)0x0) {
                    pPVar11 = pParse;
                  }
                  pPVar11->mayAbort = '\x01';
                }
              }
              pSrc->a[0].zName = (char *)0x0;
              sqlite3SrcListDelete(db,pSrc);
              bChngRowid = local_6c;
            }
            sqlite3DbFree(db,aiFree);
            aChange = local_58;
          }
          else {
            if (uVar1 == '\0') {
              return;
            }
            if (db->mallocFailed != '\0') {
              return;
            }
          }
        }
        pFVar14 = pFVar14->pNextTo;
      } while (pFVar14 != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange 
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0 
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. 
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very 
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs) 
     && !pParse->pToplevel && !pParse->isMultiWrite 
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action 
        ** trigger causes other triggers or action rules attached to the 
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are 
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}